

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Token *args_2;
  CoverageBinsArraySizeSyntax *pCVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  if (*(long *)(__fn + 0x28) == 0) {
    args_2 = (Token *)0x0;
  }
  else {
    args_2 = (Token *)deepClone<slang::syntax::ExpressionSyntax>
                                ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  }
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverageBinsArraySizeSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     (this,(Token *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverageBinsArraySizeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverageBinsArraySizeSyntax>(
        node.openBracket.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr,
        node.closeBracket.deepClone(alloc)
    );
}